

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLogging.cpp
# Opt level: O0

void Jinx::Impl::InitializeLogging(GlobalParams *params)

{
  bool bVar1;
  GlobalParams *params_local;
  
  Log::enableLogging = (bool)(params->enableLogging & 1);
  if (Log::enableLogging != false) {
    bVar1 = std::function::operator_cast_to_bool((function *)params);
    if (bVar1) {
      std::function<void_(Jinx::LogLevel,_const_char_*)>::operator=(&Log::logFn,&params->logFn);
    }
    Log::logSymbols = (bool)(params->logSymbols & 1);
    Log::logBytecode = (bool)(params->logBytecode & 1);
  }
  return;
}

Assistant:

inline_t void InitializeLogging(const GlobalParams & params)
	{
		Log::enableLogging = params.enableLogging;
		if (Log::enableLogging)
		{
			if (params.logFn)
				Log::logFn = params.logFn;
			Log::logSymbols = params.logSymbols;
			Log::logBytecode = params.logBytecode;
		}
	}